

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCanon.c
# Opt level: O2

int Map_CanonComputeSlow
              (uint (*uTruths) [2],int nVarsMax,int nVarsReal,uint *uTruth,uchar *puPhases,
              uint *uTruthRes)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  int v;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  bVar1 = (byte)nVarsReal & 0x1f;
  uVar6 = 1 << bVar1;
  *uTruthRes = 0xffffffff;
  if (nVarsMax < 6) {
    iVar4 = 0;
    uVar8 = (ulong)(uint)nVarsMax;
    if (nVarsMax < 1) {
      uVar8 = 0;
    }
    if (1 << bVar1 < 1) {
      uVar6 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      uVar11 = *uTruth;
      uVar12 = 1;
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        if ((uVar12 & uVar7) != 0) {
          uVar11 = (uTruths[uVar10][0] & uVar11) >> ((byte)uVar12 & 0x1f) |
                   (~uTruths[uVar10][0] & uVar11) << ((byte)uVar12 & 0x1f);
        }
        uVar12 = uVar12 * 2;
      }
      if (uVar11 < *uTruthRes) {
        *uTruthRes = uVar11;
        *puPhases = (uchar)uVar7;
        iVar4 = 1;
      }
      else if (iVar4 < 4 && *uTruthRes == uVar11) {
        lVar5 = (long)iVar4;
        iVar4 = iVar4 + 1;
        puPhases[lVar5] = (uchar)uVar7;
      }
    }
    uTruthRes[1] = *uTruthRes;
  }
  else {
    uTruthRes[1] = 0xffffffff;
    iVar4 = 0;
    if (1 << bVar1 < 1) {
      uVar6 = 0;
    }
    for (uVar7 = 0; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      uVar11 = *uTruth;
      uVar12 = uTruth[1];
      if (uVar7 != 0) {
        uVar10 = 1;
        for (uVar8 = 0; (uint)nVarsMax != uVar8; uVar8 = uVar8 + 1) {
          uVar9 = (uint)uVar10;
          uVar2 = uVar11;
          uVar3 = uVar12;
          if (((uVar9 & uVar7) != 0) && (uVar2 = uVar12, uVar3 = uVar11, (int)uVar9 < 0x20)) {
            uVar2 = uTruths[uVar8][0];
            uVar3 = uTruths[uVar8][1];
            uVar2 = (uVar2 & uVar11) >> uVar10 | (~uVar2 & uVar11) << uVar9;
            uVar3 = (uVar3 & uVar12) >> uVar10 | ~uVar3 & uVar12;
          }
          uVar12 = uVar3;
          uVar11 = uVar2;
          uVar10 = (ulong)(uVar9 * 2);
        }
      }
      if (uVar12 < uTruthRes[1]) {
LAB_006f95c8:
        *uTruthRes = uVar11;
        uTruthRes[1] = uVar12;
        *puPhases = (uchar)uVar7;
        iVar4 = 1;
      }
      else if (uTruthRes[1] == uVar12) {
        if (uVar11 < *uTruthRes) goto LAB_006f95c8;
        if (iVar4 < 4 && *uTruthRes == uVar11) {
          lVar5 = (long)iVar4;
          iVar4 = iVar4 + 1;
          puPhases[lVar5] = (uchar)uVar7;
        }
      }
    }
  }
  if (iVar4 < 1) {
    __assert_fail("nPhases > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperCanon.c"
                  ,0x60,
                  "int Map_CanonComputeSlow(unsigned int (*)[2], int, int, unsigned int *, unsigned char *, unsigned int *)"
                 );
  }
  return iVar4;
}

Assistant:

int Map_CanonComputeSlow( unsigned uTruths[][2], int nVarsMax, int nVarsReal, unsigned uTruth[], unsigned char * puPhases, unsigned uTruthRes[] )
{
    unsigned  uTruthPerm[2];
    int nMints, nPhases, m;

    nPhases = 0;
    nMints = (1 << nVarsReal);
    if ( nVarsMax < 6 )
    {
        uTruthRes[0] = MAP_MASK(32);
        for ( m = 0; m < nMints; m++ )
        {
            uTruthPerm[0] = Map_CanonComputePhase( uTruths, nVarsMax, uTruth[0], m );
            if ( uTruthRes[0] > uTruthPerm[0] )
            {
                uTruthRes[0] = uTruthPerm[0];
                nPhases      = 0;
                puPhases[nPhases++] = (unsigned char)m;
            }
            else if ( uTruthRes[0] == uTruthPerm[0] )
            {
                if ( nPhases < 4 ) // the max number of phases in Map_Super_t
                    puPhases[nPhases++] = (unsigned char)m;
            }
        }
        uTruthRes[1] = uTruthRes[0];
    }
    else
    {
        uTruthRes[0] = MAP_MASK(32);
        uTruthRes[1] = MAP_MASK(32);
        for ( m = 0; m < nMints; m++ )
        {
            Map_CanonComputePhase6( uTruths, nVarsMax, uTruth, m, uTruthPerm );
            if ( uTruthRes[1] > uTruthPerm[1] || (uTruthRes[1] == uTruthPerm[1] && uTruthRes[0] > uTruthPerm[0]) )
            {
                uTruthRes[0] = uTruthPerm[0];
                uTruthRes[1] = uTruthPerm[1];
                nPhases      = 0;
                puPhases[nPhases++] = (unsigned char)m;
            }
            else if ( uTruthRes[1] == uTruthPerm[1] && uTruthRes[0] == uTruthPerm[0] )
            {
                if ( nPhases < 4 ) // the max number of phases in Map_Super_t
                    puPhases[nPhases++] = (unsigned char)m;
            }
        }
    }
    assert( nPhases > 0 );
//    printf( "%d ", nPhases );
    return nPhases;
}